

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InferenceStore.cpp
# Opt level: O1

void __thiscall
Kernel::InferenceStore::TPTPProofPrinter::printSplitting(TPTPProofPrinter *this,Unit *us)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  InferenceRule rule;
  uint uVar2;
  char cVar3;
  long *plVar4;
  Unit *pUVar5;
  ostream *poVar6;
  size_type *psVar7;
  SplitSet **ppSVar8;
  UnitIterator parents;
  string inferenceStr;
  string local_108;
  long *local_e8;
  SplitSet **local_e0;
  long local_d8;
  SplitSet *local_d0;
  void *pvStack_c8;
  uint local_bc;
  string local_b8;
  Unit *local_98;
  string local_90;
  string local_70;
  string local_50;
  
  rule = (us->_inference).field_0x1;
  Unit::getParents((Unit *)&local_e8);
  tptpRuleName_abi_cxx11_(&local_b8,this,rule);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,0x919abb);
  paVar1 = &local_108.field_2;
  psVar7 = (size_type *)(plVar4 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar4 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar7) {
    local_108.field_2._M_allocated_capacity = *psVar7;
    local_108.field_2._8_8_ = plVar4[3];
    local_108._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_108.field_2._M_allocated_capacity = *psVar7;
    local_108._M_dataplus._M_p = (pointer)*plVar4;
  }
  local_108._M_string_length = plVar4[1];
  *plVar4 = (long)psVar7;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_108);
  local_e0 = &local_d0;
  ppSVar8 = (SplitSet **)(plVar4 + 2);
  if ((SplitSet **)*plVar4 == ppSVar8) {
    local_d0 = *ppSVar8;
    pvStack_c8 = (void *)plVar4[3];
  }
  else {
    local_d0 = *ppSVar8;
    local_e0 = (SplitSet **)*plVar4;
  }
  local_d8 = plVar4[1];
  *plVar4 = (long)ppSVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar1) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  (**(code **)(*local_e8 + 0x10))();
  pUVar5 = (Unit *)(**(code **)(*local_e8 + 0x18))();
  tptpUnitId_abi_cxx11_(&local_108,this,pUVar5);
  std::__cxx11::string::_M_append((char *)&local_e0,(ulong)local_108._M_dataplus._M_p);
  local_bc = (uint)rule;
  local_98 = us;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar1) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  while( true ) {
    cVar3 = (**(code **)(*local_e8 + 0x10))();
    if (cVar3 == '\0') break;
    pUVar5 = (Unit *)(**(code **)(*local_e8 + 0x18))();
    tptpDefId_abi_cxx11_(&local_b8,this,pUVar5);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,0x919ab2);
    psVar7 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_108.field_2._M_allocated_capacity = *psVar7;
      local_108.field_2._8_8_ = plVar4[3];
      local_108._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_108.field_2._M_allocated_capacity = *psVar7;
      local_108._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_108._M_string_length = plVar4[1];
    *plVar4 = (long)psVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&local_e0,(ulong)local_108._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != paVar1) {
      operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::string::append((char *)&local_e0);
  pUVar5 = local_98;
  uVar2 = local_bc;
  poVar6 = (this->super_ProofPrinter).out;
  tptpUnitId_abi_cxx11_(&local_50,this,local_98);
  getFormulaString_abi_cxx11_(&local_70,this,pUVar5);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_90,local_e0,local_d8 + (long)local_e0);
  getFofString(&local_108,this,&local_50,&local_70,&local_90,(InferenceRule)uVar2,AXIOM);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar6,local_108._M_dataplus._M_p,local_108._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != paVar1) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (local_e0 != &local_d0) {
    operator_delete(local_e0,(ulong)((long)&local_d0->_size + 1));
  }
  if (local_e8 != (long *)0x0) {
    plVar4 = local_e8 + 1;
    *(int *)plVar4 = (int)*plVar4 + -1;
    if ((int)*plVar4 == 0) {
      (**(code **)(*local_e8 + 8))();
    }
  }
  return;
}

Assistant:

void printSplitting(Unit* us)
  {
    ASS(us->isClause());

    InferenceRule rule = us->inference().rule();
    UnitIterator parents= us->getParents();
    ASS(rule==InferenceRule::GENERAL_SPLITTING);

    std::string inferenceStr="inference("+tptpRuleName(rule)+",[],[";

    //here we rely on the fact that the base premise is always put as the first premise in
    //GeneralSplitting::apply

    ALWAYS(parents.hasNext());
    Unit* base=parents.next();
    inferenceStr+=tptpUnitId(base);

    ASS(parents.hasNext()); //we always split off at least one component
    while(parents.hasNext()) {
      Unit* comp=parents.next();
      ASS(_is->_splittingNameLiterals.find(comp));
      inferenceStr+=","+tptpDefId(comp);
    }
    inferenceStr+="])";

    out<<getFofString(tptpUnitId(us), getFormulaString(us), inferenceStr, rule)<<endl;
  }